

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::addQueue(CLIntercept *this,cl_context context,cl_command_queue queue)

{
  uint uVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  cl_command_queue local_28;
  cl_context local_20;
  
  if (queue != (cl_command_queue)0x0) {
    local_28 = queue;
    local_20 = context;
    std::mutex::lock(&this->m_Mutex);
    uVar1 = this->m_QueueNumber;
    pmVar2 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](&this->m_QueueNumberMap,&local_28);
    *pmVar2 = uVar1 + 1;
    this->m_QueueNumber = this->m_QueueNumber + 1;
    this_00 = std::
              map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
              ::operator[](&this->m_ContextQueuesMap,&local_20);
    std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::push_back
              (this_00,&local_28);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addQueue(
    cl_context context,
    cl_command_queue queue )
{
    if( queue )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_QueueNumberMap[ queue ] = m_QueueNumber + 1;  // should be nonzero
        m_QueueNumber++;

        m_ContextQueuesMap[context].push_back(queue);
    }
}